

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

bool ImGui::BeginTableEx(char *name,ImGuiID id,int columns_count,ImGuiTableFlags flags,
                        ImVec2 *outer_size,float inner_width)

{
  ImDrawListSplitter *pIVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  double dVar4;
  ImGuiWindow *pIVar5;
  ImGuiTableTempData *pIVar6;
  ImGuiTableInstanceData *pIVar7;
  ImGuiWindow *pIVar8;
  float *__src;
  ImGuiTableColumn *pIVar9;
  float fVar10;
  uint uVar11;
  ImGuiContext *pIVar12;
  bool bVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ImU32 IVar17;
  ImGuiTableColumn *p;
  ImGuiTable *p_00;
  ImGuiTableTempData *__dest;
  ImGuiTableInstanceData *__dest_00;
  float *__dest_01;
  ImGuiTableColumn *pIVar18;
  char *pcVar19;
  ImGuiTableColumn *pIVar20;
  char *__dest_02;
  int iVar21;
  int iVar22;
  uint uVar23;
  long lVar24;
  ImRect *pIVar25;
  ulong uVar26;
  long lVar27;
  size_t size;
  int iVar28;
  ImVec2 *pIVar29;
  ImGuiTableColumnFlags *pIVar30;
  ImVec2 *pIVar31;
  long lVar32;
  int iVar33;
  int iVar34;
  ulong uVar35;
  byte bVar36;
  float fVar37;
  undefined4 in_XMM0_Db;
  ImVec2 IVar38;
  ImVec2 IVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  ImGuiContext *g;
  ImRect outer_rect;
  void *local_108;
  ImRect local_e8;
  undefined8 local_d8;
  ImGuiTableInstanceData *local_c0;
  ImGuiTableTempData *local_b8;
  char *local_b0;
  ImVec2 local_a8;
  undefined8 uStack_a0;
  ImDrawListSplitter local_98;
  undefined3 uStack_80;
  undefined5 uStack_7d;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined3 uStack_70;
  undefined5 uStack_6d;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pIVar12 = GImGui;
  bVar36 = 0;
  local_d8 = (ImGuiWindow *)CONCAT44(in_XMM0_Db,inner_width);
  pIVar5 = GImGui->CurrentWindow;
  pIVar5->WriteAccessed = true;
  if (pIVar5->SkipItems != false) {
    return false;
  }
  uVar26 = (ulong)(uint)columns_count;
  if (0x3f < columns_count - 1U) {
    __assert_fail("columns_count > 0 && columns_count <= 64 && \"Only 1..64 columns allowed!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_tables.cpp"
                  ,0x13e,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  if ((((uint)flags >> 0x18 & 1) != 0) && (inner_width < 0.0)) {
    __assert_fail("inner_width >= 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_tables.cpp"
                  ,0x140,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  IVar38 = GetContentRegionAvail();
  fVar40 = IVar38.x;
  fVar42 = IVar38.y;
  if (fVar40 <= 1.0) {
    fVar40 = 1.0;
  }
  if ((flags & 0x3000000U) == 0) {
    IVar38 = CalcItemSize(*outer_size,fVar40,0.0);
    local_e8.Min = (pIVar5->DC).CursorPos;
    local_e8.Max.y = IVar38.y + (pIVar5->DC).CursorPos.y;
    local_e8.Max.x = (pIVar5->DC).CursorPos.x + IVar38.x;
  }
  else {
    if (fVar42 <= 1.0) {
      fVar42 = 1.0;
    }
    IVar38 = CalcItemSize(*outer_size,fVar40,fVar42);
    local_e8.Min = (pIVar5->DC).CursorPos;
    local_e8.Max.y = IVar38.y + (pIVar5->DC).CursorPos.y;
    local_e8.Max.x = (pIVar5->DC).CursorPos.x + IVar38.x;
    bVar13 = IsClippedEx(&local_e8,0);
    if (bVar13) {
      ItemSize(&local_e8,-1.0);
      return false;
    }
  }
  local_c0 = (ImGuiTableInstanceData *)outer_size;
  local_b0 = name;
  p_00 = ImPool<ImGuiTable>::GetOrAddByKey(&pIVar12->Tables,id);
  iVar21 = 0;
  if (p_00->LastFrameActive == pIVar12->FrameCount) {
    iVar21 = p_00->InstanceCurrent + 1;
  }
  uVar23 = p_00->Flags;
  if ((0 < iVar21) && (p_00->ColumnsCount != columns_count)) {
    __assert_fail("table->ColumnsCount == columns_count && \"BeginTable(): Cannot change columns count mid-frame while preserving same ID\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_tables.cpp"
                  ,0x153,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  uVar14 = ImPool<ImGuiTable>::GetIndex(&pIVar12->Tables,p_00);
  iVar28 = pIVar12->TablesTempDataStacked;
  iVar34 = (int)((long)iVar28 + 1);
  pIVar12->TablesTempDataStacked = iVar34;
  if ((pIVar12->TablesTempData).Size <= iVar28) {
    uStack_a0 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_74 = 0;
    uStack_70 = 0;
    uStack_6d = 0;
    local_98._Channels.Data = (ImDrawChannel *)0x0;
    uStack_80 = 0;
    uStack_7d = 0;
    local_98._Current = 0;
    local_98._Count = 0;
    local_98._Channels.Size = 0;
    local_98._Channels.Capacity = 0;
    local_a8.x = 0.0;
    local_a8.y = -1.0;
    iVar22 = (pIVar12->TablesTempData).Capacity;
    if (iVar22 <= iVar28) {
      if (iVar22 == 0) {
        iVar33 = 8;
      }
      else {
        iVar33 = iVar22 / 2 + iVar22;
      }
      if (iVar33 <= iVar34) {
        iVar33 = iVar34;
      }
      if (iVar22 < iVar33) {
        __dest = (ImGuiTableTempData *)MemAlloc((long)iVar33 * 0x70);
        pIVar6 = (pIVar12->TablesTempData).Data;
        if (pIVar6 != (ImGuiTableTempData *)0x0) {
          local_b8 = __dest;
          memcpy(__dest,pIVar6,(long)(pIVar12->TablesTempData).Size * 0x70);
          MemFree((pIVar12->TablesTempData).Data);
          __dest = local_b8;
        }
        (pIVar12->TablesTempData).Data = __dest;
        (pIVar12->TablesTempData).Capacity = iVar33;
      }
    }
    iVar22 = (pIVar12->TablesTempData).Size;
    if (iVar22 <= iVar28) {
      lVar27 = ((long)iVar28 + 1) - (long)iVar22;
      lVar32 = (long)iVar22 * 0x70;
      do {
        pIVar29 = &local_a8;
        pIVar31 = (ImVec2 *)((long)&((pIVar12->TablesTempData).Data)->TableIndex + lVar32);
        for (lVar24 = 0xe; lVar24 != 0; lVar24 = lVar24 + -1) {
          *pIVar31 = *pIVar29;
          pIVar29 = pIVar29 + (ulong)bVar36 * -2 + 1;
          pIVar31 = pIVar31 + (ulong)bVar36 * -2 + 1;
        }
        lVar32 = lVar32 + 0x70;
        lVar27 = lVar27 + -1;
      } while (lVar27 != 0);
    }
    (pIVar12->TablesTempData).Size = iVar34;
    ImDrawListSplitter::ClearFreeMemory(&local_98);
    if (local_98._Channels.Data != (ImDrawChannel *)0x0) {
      MemFree(local_98._Channels.Data);
    }
  }
  lVar27 = (long)pIVar12->TablesTempDataStacked;
  if ((lVar27 < 1) || ((pIVar12->TablesTempData).Size < pIVar12->TablesTempDataStacked)) {
    pcVar19 = "T &ImVector<ImGuiTableTempData>::operator[](int) [T = ImGuiTableTempData]";
  }
  else {
    pIVar6 = (pIVar12->TablesTempData).Data;
    p_00->TempData = pIVar6 + lVar27 + -1;
    pIVar6[lVar27 + -1].TableIndex = uVar14;
    pIVar1 = &pIVar6[lVar27 + -1].DrawSplitter;
    p_00->DrawSplitter = pIVar1;
    pIVar1->_Current = 0;
    pIVar1->_Count = 1;
    bVar13 = (flags & 0xe000U) == 0;
    p_00->IsDefaultSizingPolicy = bVar13;
    uVar15 = flags;
    if (bVar13) {
      uVar15 = 0x2000;
      if ((((uint)flags >> 0x18 & 1) == 0) && (uVar15 = 0x2000, (pIVar5->Flags & 0x40) == 0)) {
        uVar15 = 0x8000;
      }
      uVar15 = uVar15 | flags;
    }
    uVar16 = uVar15 | 0x40000;
    if ((uVar15 & 0xe000) != 0x4000) {
      uVar16 = uVar15;
    }
    uVar15 = uVar16 & 0xfffcffff;
    if ((uVar16 & 0x3000000) == 0) {
      uVar15 = uVar16;
    }
    uVar11 = uVar15 & 0xfffff7ff;
    if ((uVar15 >> 0xc & 1) == 0) {
      uVar11 = uVar15;
    }
    uVar15 = (uVar16 & 1) << 9 | uVar11;
    uVar16 = uVar15 | 0x10;
    if ((uVar11 & 0xf) == 0) {
      uVar15 = uVar16;
    }
    if (((uint)pIVar5->RootWindow->Flags >> 8 & 1) != 0) {
      uVar15 = uVar16;
    }
    p_00->ID = id;
    p_00->Flags = uVar15;
    p_00->InstanceCurrent = (ImS16)iVar21;
    p_00->LastFrameActive = pIVar12->FrameCount;
    p_00->InnerWindow = pIVar5;
    p_00->OuterWindow = pIVar5;
    p_00->ColumnsCount = columns_count;
    p_00->IsLayoutLocked = false;
    p_00->InnerWidth = (float)local_d8;
    fVar40 = local_c0->LastFirstRowHeight;
    pIVar6[lVar27 + -1].UserOuterSize.x = local_c0->LastOuterHeight;
    pIVar6[lVar27 + -1].UserOuterSize.y = fVar40;
    if ((0 < iVar21) && (iVar28 = (p_00->InstanceDataExtra).Size, iVar28 < iVar21)) {
      iVar34 = (p_00->InstanceDataExtra).Capacity;
      if (iVar28 == iVar34) {
        if (iVar34 == 0) {
          iVar22 = 8;
        }
        else {
          iVar22 = iVar34 / 2 + iVar34;
        }
        iVar33 = iVar28 + 1;
        if (iVar28 + 1 < iVar22) {
          iVar33 = iVar22;
        }
        if (iVar34 < iVar33) {
          __dest_00 = (ImGuiTableInstanceData *)MemAlloc((long)iVar33 << 3);
          pIVar7 = (p_00->InstanceDataExtra).Data;
          if (pIVar7 != (ImGuiTableInstanceData *)0x0) {
            local_c0 = __dest_00;
            memcpy(__dest_00,pIVar7,(long)(p_00->InstanceDataExtra).Size << 3);
            MemFree((p_00->InstanceDataExtra).Data);
            __dest_00 = local_c0;
          }
          (p_00->InstanceDataExtra).Data = __dest_00;
          (p_00->InstanceDataExtra).Capacity = iVar33;
        }
      }
      pIVar7 = (p_00->InstanceDataExtra).Data + (p_00->InstanceDataExtra).Size;
      pIVar7->LastOuterHeight = 0.0;
      pIVar7->LastFirstRowHeight = 0.0;
      (p_00->InstanceDataExtra).Size = (p_00->InstanceDataExtra).Size + 1;
    }
    if ((flags & 0x3000000U) == 0) {
      (p_00->InnerRect).Min = local_e8.Min;
      (p_00->InnerRect).Max = local_e8.Max;
      (p_00->OuterRect).Min = local_e8.Min;
      (p_00->OuterRect).Max = local_e8.Max;
      (p_00->WorkRect).Min = local_e8.Min;
      (p_00->WorkRect).Max = local_e8.Max;
    }
    else {
      fVar40 = (float)local_d8;
      if ((uVar15 & 0x1000000) == 0) {
        fVar40 = 3.4028235e+38;
      }
      fVar40 = (float)(~-(uint)(0.0 < (float)local_d8) & 0x7f7fffff |
                      (uint)fVar40 & -(uint)(0.0 < (float)local_d8));
      if (fVar40 != 3.4028235e+38 || (uVar15 & 0x3000000) == 0x1000000) {
        if ((uVar15 & 0x3000000) == 0x1000000) {
          local_a8.y = 1.1754944e-38;
        }
        else {
          local_a8.y = 0.0;
        }
        local_a8.x = (float)(-(uint)(fVar40 != 3.4028235e+38) & (uint)fVar40);
        SetNextWindowContentSize(&local_a8);
      }
      if ((uVar23 & 0x3000000) == 0) {
        local_a8.x = 0.0;
        local_a8.y = 0.0;
        SetNextWindowScroll(&local_a8);
      }
      local_a8.x = local_e8.Max.x - local_e8.Min.x;
      local_a8.y = local_e8.Max.y - local_e8.Min.y;
      BeginChildEx(local_b0,iVar21 + id,&local_a8,false,(uVar15 & 0x1000000) >> 0xd);
      pIVar8 = pIVar12->CurrentWindow;
      p_00->InnerWindow = pIVar8;
      IVar38 = (pIVar8->WorkRect).Max;
      (p_00->WorkRect).Min = (pIVar8->WorkRect).Min;
      (p_00->WorkRect).Max = IVar38;
      fVar40 = (pIVar8->Pos).x;
      fVar42 = (pIVar8->Pos).y;
      fVar37 = (pIVar8->Size).x;
      fVar41 = (pIVar8->Size).y;
      fVar10 = (pIVar8->Pos).y;
      (p_00->OuterRect).Min.x = (pIVar8->Pos).x;
      (p_00->OuterRect).Min.y = fVar10;
      (p_00->OuterRect).Max.x = fVar40 + fVar37;
      (p_00->OuterRect).Max.y = fVar42 + fVar41;
      IVar38 = (pIVar8->InnerRect).Max;
      (p_00->InnerRect).Min = (pIVar8->InnerRect).Min;
      (p_00->InnerRect).Max = IVar38;
      if (((((pIVar8->WindowPadding).x != 0.0) ||
           (fVar40 = (pIVar8->WindowPadding).y, fVar40 != 0.0)) || (NAN(fVar40))) ||
         ((pIVar8->WindowBorderSize != 0.0 || (NAN(pIVar8->WindowBorderSize))))) {
        __assert_fail("table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_tables.cpp"
                      ,0x18d,
                      "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                     );
      }
    }
    PushOverrideID(iVar21 + id);
    pIVar8 = p_00->InnerWindow;
    p_00->HostIndentX = (pIVar8->DC).Indent.x;
    IVar38 = (pIVar8->ClipRect).Max;
    (p_00->HostClipRect).Min = (pIVar8->ClipRect).Min;
    (p_00->HostClipRect).Max = IVar38;
    p_00->HostSkipItems = pIVar8->SkipItems;
    IVar38 = (pIVar8->WorkRect).Max;
    pIVar6[lVar27 + -1].HostBackupWorkRect.Min = (pIVar8->WorkRect).Min;
    pIVar6[lVar27 + -1].HostBackupWorkRect.Max = IVar38;
    IVar38 = (pIVar8->ParentWorkRect).Max;
    pIVar6[lVar27 + -1].HostBackupParentWorkRect.Min = (pIVar8->ParentWorkRect).Min;
    pIVar6[lVar27 + -1].HostBackupParentWorkRect.Max = IVar38;
    pIVar6[lVar27 + -1].HostBackupColumnsOffset.x = (pIVar5->DC).ColumnsOffset.x;
    pIVar6[lVar27 + -1].HostBackupPrevLineSize = (pIVar8->DC).PrevLineSize;
    pIVar6[lVar27 + -1].HostBackupCurrLineSize = (pIVar8->DC).CurrLineSize;
    pIVar6[lVar27 + -1].HostBackupCursorMaxPos = (pIVar8->DC).CursorMaxPos;
    pIVar6[lVar27 + -1].HostBackupItemWidth = (pIVar5->DC).ItemWidth;
    pIVar6[lVar27 + -1].HostBackupItemWidthStackSize = (pIVar5->DC).ItemWidthStack.Size;
    fVar40 = 0.0;
    fVar42 = 0.0;
    if ((uVar15 >> 9 & 1) != 0) {
      fVar42 = 1.0;
    }
    (pIVar8->DC).CurrLineSize.x = 0.0;
    (pIVar8->DC).CurrLineSize.y = 0.0;
    (pIVar8->DC).PrevLineSize.x = 0.0;
    (pIVar8->DC).PrevLineSize.y = 0.0;
    if ((uVar15 & 0x800200) == 0) {
      fVar40 = (pIVar12->Style).CellPadding.x;
    }
    fVar41 = 0.0;
    fVar37 = 0.0;
    if ((uVar15 & 0x800200) == 0x200) {
      fVar37 = (pIVar12->Style).CellPadding.x;
    }
    p_00->CellSpacingX1 = fVar42 + fVar40;
    p_00->CellSpacingX2 = fVar40;
    p_00->CellPaddingX = fVar37;
    p_00->CellPaddingY = (pIVar12->Style).CellPadding.y;
    fVar40 = 0.0;
    if ((uVar15 >> 10 & 1) != 0) {
      fVar40 = 1.0;
    }
    if ((uVar15 >> 0x16 & 1) == 0 && (uVar15 & 0x200400) != 0) {
      fVar41 = (pIVar12->Style).CellPadding.x;
    }
    p_00->OuterPaddingX = (fVar40 + fVar41) - fVar37;
    p_00->CurrentRow = -1;
    p_00->CurrentColumn = -1;
    p_00->RowBgColorCounter = 0;
    *(uint *)&p_00->field_0x98 = (uint)*(ushort *)&p_00->field_0x98;
    pIVar25 = &pIVar8->ClipRect;
    if (pIVar8 == pIVar5) {
      pIVar25 = &p_00->WorkRect;
    }
    IVar38 = pIVar25->Max;
    (p_00->InnerClipRect).Min = pIVar25->Min;
    (p_00->InnerClipRect).Max = IVar38;
    fVar40 = (p_00->InnerClipRect).Min.x;
    fVar42 = (p_00->InnerClipRect).Min.y;
    fVar37 = (p_00->WorkRect).Min.x;
    fVar41 = (p_00->WorkRect).Min.y;
    uVar16 = -(uint)(fVar37 <= fVar40);
    IVar38.x = (float)(~uVar16 & (uint)fVar37 | (uint)fVar40 & uVar16);
    uVar16 = -(uint)(fVar41 <= fVar42);
    IVar38.y = (float)(~uVar16 & (uint)fVar41 | (uint)fVar42 & uVar16);
    (p_00->InnerClipRect).Min = IVar38;
    fVar42 = (p_00->InnerClipRect).Max.x;
    fVar40 = (p_00->WorkRect).Max.x;
    if (fVar40 <= fVar42) {
      fVar42 = fVar40;
    }
    fVar40 = (p_00->InnerClipRect).Max.y;
    fVar37 = (p_00->WorkRect).Max.y;
    if (fVar37 <= fVar40) {
      fVar40 = fVar37;
    }
    IVar39.y = fVar40;
    IVar39.x = fVar42;
    (p_00->InnerClipRect).Max = IVar39;
    ImRect::ClipWithFull(&p_00->InnerClipRect,&p_00->HostClipRect);
    if ((uVar15 >> 0x11 & 1) == 0) {
      fVar40 = (pIVar8->ClipRect).Max.y;
    }
    else {
      fVar40 = (p_00->InnerClipRect).Max.y;
      fVar42 = (pIVar8->WorkRect).Max.y;
      if (fVar42 <= fVar40) {
        fVar40 = fVar42;
      }
    }
    (p_00->InnerClipRect).Max.y = fVar40;
    fVar40 = (p_00->WorkRect).Min.y;
    p_00->RowPosY2 = fVar40;
    p_00->RowPosY1 = fVar40;
    p_00->RowTextBaseline = 0.0;
    p_00->FreezeRowsRequest = '\0';
    p_00->FreezeRowsCount = '\0';
    p_00->FreezeColumnsRequest = '\0';
    p_00->FreezeColumnsCount = '\0';
    p_00->IsUnfrozenRows = true;
    p_00->DeclColumnsCount = '\0';
    IVar17 = GetColorU32(0x2d,1.0);
    p_00->BorderColorStrong = IVar17;
    IVar17 = GetColorU32(0x2e,1.0);
    p_00->BorderColorLight = IVar17;
    pIVar12->CurrentTable = p_00;
    (pIVar5->DC).CurrentTableIdx = uVar14;
    if (pIVar8 != pIVar5) {
      (pIVar8->DC).CurrentTableIdx = uVar14;
    }
    if (((uVar23 & 2) != 0) && ((uVar15 & 2) == 0)) {
      p_00->IsResetDisplayOrderRequest = true;
    }
    if ((pIVar12->TablesLastTimeActive).Size <= (int)uVar14) {
      iVar28 = uVar14 + 1;
      iVar21 = (pIVar12->TablesLastTimeActive).Capacity;
      if (iVar21 <= (int)uVar14) {
        if (iVar21 == 0) {
          iVar34 = 8;
        }
        else {
          iVar34 = iVar21 / 2 + iVar21;
        }
        if (iVar34 <= iVar28) {
          iVar34 = iVar28;
        }
        if (iVar21 < iVar34) {
          __dest_01 = (float *)MemAlloc((long)iVar34 << 2);
          __src = (pIVar12->TablesLastTimeActive).Data;
          if (__src != (float *)0x0) {
            local_d8 = (ImGuiWindow *)__dest_01;
            memcpy(__dest_01,__src,(long)(pIVar12->TablesLastTimeActive).Size << 2);
            MemFree((pIVar12->TablesLastTimeActive).Data);
            __dest_01 = (float *)local_d8;
          }
          (pIVar12->TablesLastTimeActive).Data = __dest_01;
          (pIVar12->TablesLastTimeActive).Capacity = iVar34;
        }
      }
      iVar21 = (pIVar12->TablesLastTimeActive).Size;
      lVar32 = (long)iVar21;
      if (iVar21 <= (int)uVar14) {
        do {
          (pIVar12->TablesLastTimeActive).Data[lVar32] = -1.0;
          lVar32 = lVar32 + 1;
        } while (iVar28 != lVar32);
      }
      (pIVar12->TablesLastTimeActive).Size = iVar28;
    }
    if ((-1 < (int)uVar14) && ((int)uVar14 < (pIVar12->TablesLastTimeActive).Size)) {
      dVar4 = pIVar12->Time;
      (pIVar12->TablesLastTimeActive).Data[uVar14] = (float)dVar4;
      pIVar6[lVar27 + -1].LastTimeActive = (float)dVar4;
      p_00->MemoryCompacted = false;
      pIVar20 = (p_00->Columns).Data;
      iVar21 = (int)((long)(p_00->Columns).DataEnd - (long)pIVar20 >> 3) * -0x3b13b13b;
      if (iVar21 == columns_count || iVar21 == 0) {
        local_108 = (void *)0x0;
        pIVar20 = (ImGuiTableColumn *)0x0;
      }
      else {
        local_108 = p_00->RawData;
        p_00->RawData = (void *)0x0;
      }
      local_d8 = pIVar8;
      if (p_00->RawData == (void *)0x0) {
        TableBeginInitMemory(p_00,columns_count);
        p_00->IsSettingsRequestLoad = true;
        p_00->IsInitializing = true;
      }
      if (p_00->IsResetAllRequest == true) {
        p_00->IsInitializing = true;
        p_00->IsResetAllRequest = false;
        p_00->IsSettingsRequestLoad = false;
        p_00->IsSettingsDirty = true;
        p_00->SettingsLoadedFlags = 0;
      }
      if (p_00->IsInitializing == true) {
        p_00->SettingsOffset = -1;
        p_00->IsSortSpecsDirty = true;
        p_00->InstanceInteracted = -1;
        p_00->ContextPopupColumn = -1;
        p_00->ReorderColumn = -1;
        p_00->HoveredColumnBody = -1;
        p_00->HoveredColumnBorder = -1;
        p_00->AutoFitSingleColumn = -1;
        p_00->ResizedColumn = -1;
        p_00->LastResizedColumn = -1;
        if (0 < columns_count) {
          lVar27 = 0x61;
          uVar35 = 0;
          do {
            pIVar9 = (p_00->Columns).Data;
            pIVar18 = (ImGuiTableColumn *)((long)pIVar9 + lVar27 + -0x61);
            if ((p_00->Columns).DataEnd <= pIVar18) goto LAB_00191960;
            if ((pIVar20 == (ImGuiTableColumn *)0x0) || ((long)iVar21 <= (long)uVar35)) {
              uVar3 = *(undefined4 *)((long)pIVar9 + lVar27 + -0x4d);
              local_78 = 0;
              local_98._Channels.Data = (ImDrawChannel *)0x0;
              uStack_80 = 0;
              uStack_7d = 0;
              local_98._Current = 0;
              local_98._Count = 0;
              local_98._Channels.Size = 0;
              local_98._Channels.Capacity = 0;
              local_a8.x = 0.0;
              local_a8.y = 0.0;
              uStack_a0 = 0;
              uStack_70 = 0xffffff;
              uStack_74 = 0xffffffff;
              pIVar18->Flags = 0;
              pIVar18->WidthGiven = 0.0;
              *(undefined8 *)((long)pIVar9 + lVar27 + -0x59) = 0;
              *(undefined8 *)((long)pIVar9 + lVar27 + -0x51) = 0xbf800000;
              *(undefined4 *)((long)pIVar9 + lVar27 + -0x49) = 0xbf800000;
              puVar2 = (undefined8 *)((long)pIVar9 + lVar27 + -0x45);
              *puVar2 = 0;
              puVar2[1] = 0;
              puVar2 = (undefined8 *)((long)pIVar9 + lVar27 + -0x35);
              *puVar2 = 0;
              puVar2[1] = 0;
              *(undefined1 (*) [16])((long)pIVar9 + lVar27 + -0x25) = ZEXT816(0) << 0x40;
              puVar2 = (undefined8 *)((long)pIVar9 + lVar27 + -0x1a);
              *puVar2 = 0;
              puVar2[1] = 0xffffffffffffff00;
              *(undefined2 *)((long)pIVar9 + lVar27 + -10) = 0xffff;
              *(undefined1 *)((long)pIVar9 + lVar27 + -8) = 0xff;
              *(undefined8 *)((long)pIVar9 + lVar27 + -7) = 0;
              *(undefined8 *)((long)pIVar9 + lVar27 + -2) = 0;
              *(undefined4 *)((long)pIVar9 + lVar27 + -0x4d) = uVar3;
              *(undefined1 *)((long)&pIVar9->Flags + lVar27) = 1;
              *(undefined1 *)((long)pIVar9 + lVar27 + -5) = 1;
              *(undefined2 *)((long)pIVar9 + lVar27 + -7) = 0x101;
            }
            else {
              pIVar30 = (ImGuiTableColumnFlags *)((long)pIVar20 + lVar27 + -0x61);
              for (lVar32 = 0x19; lVar32 != 0; lVar32 = lVar32 + -1) {
                pIVar18->Flags = *pIVar30;
                pIVar30 = pIVar30 + (ulong)bVar36 * -2 + 1;
                pIVar18 = (ImGuiTableColumn *)((long)pIVar18 + (ulong)bVar36 * -8 + 4);
              }
              *(undefined1 *)((long)&pIVar9->WidthGiven + lVar27 + 1) =
                   *(undefined1 *)((long)&pIVar20->WidthGiven + lVar27 + 1);
              *(undefined2 *)((long)&pIVar9->Flags + lVar27 + 3) =
                   *(undefined2 *)((long)&pIVar20->Flags + lVar27 + 3);
            }
            pcVar19 = (p_00->DisplayOrderToIndex).Data + uVar35;
            if ((p_00->DisplayOrderToIndex).DataEnd <= pcVar19) {
              pcVar19 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
              goto LAB_0019198c;
            }
            *pcVar19 = (char)uVar35;
            *(char *)((long)pIVar9 + lVar27 + -0xf) = (char)uVar35;
            uVar35 = uVar35 + 1;
            lVar27 = lVar27 + 0x68;
          } while ((uint)columns_count != uVar35);
        }
      }
      if (local_108 != (void *)0x0) {
        MemFree(local_108);
      }
      pIVar5 = local_d8;
      if (p_00->IsSettingsRequestLoad == true) {
        TableLoadSettings(p_00);
      }
      fVar40 = pIVar12->FontSize;
      fVar42 = p_00->RefScale;
      if ((fVar42 != 0.0) || (NAN(fVar42))) {
        if (((fVar42 != fVar40) || (NAN(fVar42) || NAN(fVar40))) && (0 < columns_count)) {
          pIVar20 = (p_00->Columns).Data;
          do {
            if ((p_00->Columns).DataEnd <= pIVar20) {
LAB_00191960:
              pcVar19 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
LAB_0019198c:
              __assert_fail("p >= Data && p < DataEnd",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_internal.h"
                            ,599,pcVar19);
            }
            pIVar20->WidthRequest = pIVar20->WidthRequest * (fVar40 / fVar42);
            pIVar20 = pIVar20 + 1;
            uVar26 = uVar26 - 1;
          } while (uVar26 != 0);
        }
      }
      p_00->RefScale = fVar40;
      pIVar5->SkipItems = true;
      if (0 < (p_00->ColumnsNames).Buf.Size) {
        iVar21 = (p_00->ColumnsNames).Buf.Capacity;
        if (iVar21 < 0) {
          uVar23 = iVar21 / 2 + iVar21;
          size = 0;
          if (0 < (int)uVar23) {
            size = (size_t)uVar23;
          }
          __dest_02 = (char *)MemAlloc(size);
          pcVar19 = (p_00->ColumnsNames).Buf.Data;
          if (pcVar19 != (char *)0x0) {
            memcpy(__dest_02,pcVar19,(long)(p_00->ColumnsNames).Buf.Size);
            MemFree((p_00->ColumnsNames).Buf.Data);
          }
          (p_00->ColumnsNames).Buf.Data = __dest_02;
          (p_00->ColumnsNames).Buf.Capacity = (int)size;
        }
        (p_00->ColumnsNames).Buf.Size = 0;
      }
      TableBeginApplyRequests(p_00);
      return true;
    }
    pcVar19 = "T &ImVector<float>::operator[](int) [T = float]";
  }
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                ,0x74f,pcVar19);
}

Assistant:

bool    ImGui::BeginTableEx(const char* name, ImGuiID id, int columns_count, ImGuiTableFlags flags, const ImVec2& outer_size, float inner_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* outer_window = GetCurrentWindow();
    if (outer_window->SkipItems) // Consistent with other tables + beneficial side effect that assert on miscalling EndTable() will be more visible.
        return false;

    // Sanity checks
    IM_ASSERT(columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && "Only 1..64 columns allowed!");
    if (flags & ImGuiTableFlags_ScrollX)
        IM_ASSERT(inner_width >= 0.0f);

    // If an outer size is specified ahead we will be able to early out when not visible. Exact clipping rules may evolve.
    const bool use_child_window = (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) != 0;
    const ImVec2 avail_size = GetContentRegionAvail();
    ImVec2 actual_outer_size = CalcItemSize(outer_size, ImMax(avail_size.x, 1.0f), use_child_window ? ImMax(avail_size.y, 1.0f) : 0.0f);
    ImRect outer_rect(outer_window->DC.CursorPos, outer_window->DC.CursorPos + actual_outer_size);
    if (use_child_window && IsClippedEx(outer_rect, 0))
    {
        ItemSize(outer_rect);
        return false;
    }

    // Acquire storage for the table
    ImGuiTable* table = g.Tables.GetOrAddByKey(id);
    const int instance_no = (table->LastFrameActive != g.FrameCount) ? 0 : table->InstanceCurrent + 1;
    const ImGuiID instance_id = id + instance_no;
    const ImGuiTableFlags table_last_flags = table->Flags;
    if (instance_no > 0)
        IM_ASSERT(table->ColumnsCount == columns_count && "BeginTable(): Cannot change columns count mid-frame while preserving same ID");

    // Acquire temporary buffers
    const int table_idx = g.Tables.GetIndex(table);
    if (++g.TablesTempDataStacked > g.TablesTempData.Size)
        g.TablesTempData.resize(g.TablesTempDataStacked, ImGuiTableTempData());
    ImGuiTableTempData* temp_data = table->TempData = &g.TablesTempData[g.TablesTempDataStacked - 1];
    temp_data->TableIndex = table_idx;
    table->DrawSplitter = &table->TempData->DrawSplitter;
    table->DrawSplitter->Clear();

    // Fix flags
    table->IsDefaultSizingPolicy = (flags & ImGuiTableFlags_SizingMask_) == 0;
    flags = TableFixFlags(flags, outer_window);

    // Initialize
    table->ID = id;
    table->Flags = flags;
    table->InstanceCurrent = (ImS16)instance_no;
    table->LastFrameActive = g.FrameCount;
    table->OuterWindow = table->InnerWindow = outer_window;
    table->ColumnsCount = columns_count;
    table->IsLayoutLocked = false;
    table->InnerWidth = inner_width;
    temp_data->UserOuterSize = outer_size;
    if (instance_no > 0 && table->InstanceDataExtra.Size < instance_no)
        table->InstanceDataExtra.push_back(ImGuiTableInstanceData());

    // When not using a child window, WorkRect.Max will grow as we append contents.
    if (use_child_window)
    {
        // Ensure no vertical scrollbar appears if we only want horizontal one, to make flag consistent
        // (we have no other way to disable vertical scrollbar of a window while keeping the horizontal one showing)
        ImVec2 override_content_size(FLT_MAX, FLT_MAX);
        if ((flags & ImGuiTableFlags_ScrollX) && !(flags & ImGuiTableFlags_ScrollY))
            override_content_size.y = FLT_MIN;

        // Ensure specified width (when not specified, Stretched columns will act as if the width == OuterWidth and
        // never lead to any scrolling). We don't handle inner_width < 0.0f, we could potentially use it to right-align
        // based on the right side of the child window work rect, which would require knowing ahead if we are going to
        // have decoration taking horizontal spaces (typically a vertical scrollbar).
        if ((flags & ImGuiTableFlags_ScrollX) && inner_width > 0.0f)
            override_content_size.x = inner_width;

        if (override_content_size.x != FLT_MAX || override_content_size.y != FLT_MAX)
            SetNextWindowContentSize(ImVec2(override_content_size.x != FLT_MAX ? override_content_size.x : 0.0f, override_content_size.y != FLT_MAX ? override_content_size.y : 0.0f));

        // Reset scroll if we are reactivating it
        if ((table_last_flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) == 0)
            SetNextWindowScroll(ImVec2(0.0f, 0.0f));

        // Create scrolling region (without border and zero window padding)
        ImGuiWindowFlags child_flags = (flags & ImGuiTableFlags_ScrollX) ? ImGuiWindowFlags_HorizontalScrollbar : ImGuiWindowFlags_None;
        BeginChildEx(name, instance_id, outer_rect.GetSize(), false, child_flags);
        table->InnerWindow = g.CurrentWindow;
        table->WorkRect = table->InnerWindow->WorkRect;
        table->OuterRect = table->InnerWindow->Rect();
        table->InnerRect = table->InnerWindow->InnerRect;
        IM_ASSERT(table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f);
    }
    else
    {
        // For non-scrolling tables, WorkRect == OuterRect == InnerRect.
        // But at this point we do NOT have a correct value for .Max.y (unless a height has been explicitly passed in). It will only be updated in EndTable().
        table->WorkRect = table->OuterRect = table->InnerRect = outer_rect;
    }

    // Push a standardized ID for both child-using and not-child-using tables
    PushOverrideID(instance_id);

    // Backup a copy of host window members we will modify
    ImGuiWindow* inner_window = table->InnerWindow;
    table->HostIndentX = inner_window->DC.Indent.x;
    table->HostClipRect = inner_window->ClipRect;
    table->HostSkipItems = inner_window->SkipItems;
    temp_data->HostBackupWorkRect = inner_window->WorkRect;
    temp_data->HostBackupParentWorkRect = inner_window->ParentWorkRect;
    temp_data->HostBackupColumnsOffset = outer_window->DC.ColumnsOffset;
    temp_data->HostBackupPrevLineSize = inner_window->DC.PrevLineSize;
    temp_data->HostBackupCurrLineSize = inner_window->DC.CurrLineSize;
    temp_data->HostBackupCursorMaxPos = inner_window->DC.CursorMaxPos;
    temp_data->HostBackupItemWidth = outer_window->DC.ItemWidth;
    temp_data->HostBackupItemWidthStackSize = outer_window->DC.ItemWidthStack.Size;
    inner_window->DC.PrevLineSize = inner_window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);

    // Padding and Spacing
    // - None               ........Content..... Pad .....Content........
    // - PadOuter           | Pad ..Content..... Pad .....Content.. Pad |
    // - PadInner           ........Content.. Pad | Pad ..Content........
    // - PadOuter+PadInner  | Pad ..Content.. Pad | Pad ..Content.. Pad |
    const bool pad_outer_x = (flags & ImGuiTableFlags_NoPadOuterX) ? false : (flags & ImGuiTableFlags_PadOuterX) ? true : (flags & ImGuiTableFlags_BordersOuterV) != 0;
    const bool pad_inner_x = (flags & ImGuiTableFlags_NoPadInnerX) ? false : true;
    const float inner_spacing_for_border = (flags & ImGuiTableFlags_BordersInnerV) ? TABLE_BORDER_SIZE : 0.0f;
    const float inner_spacing_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) == 0) ? g.Style.CellPadding.x : 0.0f;
    const float inner_padding_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) != 0) ? g.Style.CellPadding.x : 0.0f;
    table->CellSpacingX1 = inner_spacing_explicit + inner_spacing_for_border;
    table->CellSpacingX2 = inner_spacing_explicit;
    table->CellPaddingX = inner_padding_explicit;
    table->CellPaddingY = g.Style.CellPadding.y;

    const float outer_padding_for_border = (flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
    const float outer_padding_explicit = pad_outer_x ? g.Style.CellPadding.x : 0.0f;
    table->OuterPaddingX = (outer_padding_for_border + outer_padding_explicit) - table->CellPaddingX;

    table->CurrentColumn = -1;
    table->CurrentRow = -1;
    table->RowBgColorCounter = 0;
    table->LastRowFlags = ImGuiTableRowFlags_None;
    table->InnerClipRect = (inner_window == outer_window) ? table->WorkRect : inner_window->ClipRect;
    table->InnerClipRect.ClipWith(table->WorkRect);     // We need this to honor inner_width
    table->InnerClipRect.ClipWithFull(table->HostClipRect);
    table->InnerClipRect.Max.y = (flags & ImGuiTableFlags_NoHostExtendY) ? ImMin(table->InnerClipRect.Max.y, inner_window->WorkRect.Max.y) : inner_window->ClipRect.Max.y;

    table->RowPosY1 = table->RowPosY2 = table->WorkRect.Min.y; // This is needed somehow
    table->RowTextBaseline = 0.0f; // This will be cleared again by TableBeginRow()
    table->FreezeRowsRequest = table->FreezeRowsCount = 0; // This will be setup by TableSetupScrollFreeze(), if any
    table->FreezeColumnsRequest = table->FreezeColumnsCount = 0;
    table->IsUnfrozenRows = true;
    table->DeclColumnsCount = 0;

    // Using opaque colors facilitate overlapping elements of the grid
    table->BorderColorStrong = GetColorU32(ImGuiCol_TableBorderStrong);
    table->BorderColorLight = GetColorU32(ImGuiCol_TableBorderLight);

    // Make table current
    g.CurrentTable = table;
    outer_window->DC.CurrentTableIdx = table_idx;
    if (inner_window != outer_window) // So EndChild() within the inner window can restore the table properly.
        inner_window->DC.CurrentTableIdx = table_idx;

    if ((table_last_flags & ImGuiTableFlags_Reorderable) && (flags & ImGuiTableFlags_Reorderable) == 0)
        table->IsResetDisplayOrderRequest = true;

    // Mark as used
    if (table_idx >= g.TablesLastTimeActive.Size)
        g.TablesLastTimeActive.resize(table_idx + 1, -1.0f);
    g.TablesLastTimeActive[table_idx] = (float)g.Time;
    temp_data->LastTimeActive = (float)g.Time;
    table->MemoryCompacted = false;

    // Setup memory buffer (clear data if columns count changed)
    ImGuiTableColumn* old_columns_to_preserve = NULL;
    void* old_columns_raw_data = NULL;
    const int old_columns_count = table->Columns.size();
    if (old_columns_count != 0 && old_columns_count != columns_count)
    {
        // Attempt to preserve width on column count change (#4046)
        old_columns_to_preserve = table->Columns.Data;
        old_columns_raw_data = table->RawData;
        table->RawData = NULL;
    }
    if (table->RawData == NULL)
    {
        TableBeginInitMemory(table, columns_count);
        table->IsInitializing = table->IsSettingsRequestLoad = true;
    }
    if (table->IsResetAllRequest)
        TableResetSettings(table);
    if (table->IsInitializing)
    {
        // Initialize
        table->SettingsOffset = -1;
        table->IsSortSpecsDirty = true;
        table->InstanceInteracted = -1;
        table->ContextPopupColumn = -1;
        table->ReorderColumn = table->ResizedColumn = table->LastResizedColumn = -1;
        table->AutoFitSingleColumn = -1;
        table->HoveredColumnBody = table->HoveredColumnBorder = -1;
        for (int n = 0; n < columns_count; n++)
        {
            ImGuiTableColumn* column = &table->Columns[n];
            if (old_columns_to_preserve && n < old_columns_count)
            {
                // FIXME: We don't attempt to preserve column order in this path.
                *column = old_columns_to_preserve[n];
            }
            else
            {
                float width_auto = column->WidthAuto;
                *column = ImGuiTableColumn();
                column->WidthAuto = width_auto;
                column->IsPreserveWidthAuto = true; // Preserve WidthAuto when reinitializing a live table: not technically necessary but remove a visible flicker
                column->IsEnabled = column->IsUserEnabled = column->IsUserEnabledNextFrame = true;
            }
            column->DisplayOrder = table->DisplayOrderToIndex[n] = (ImGuiTableColumnIdx)n;
        }
    }
    if (old_columns_raw_data)
        IM_FREE(old_columns_raw_data);

    // Load settings
    if (table->IsSettingsRequestLoad)
        TableLoadSettings(table);

    // Handle DPI/font resize
    // This is designed to facilitate DPI changes with the assumption that e.g. style.CellPadding has been scaled as well.
    // It will also react to changing fonts with mixed results. It doesn't need to be perfect but merely provide a decent transition.
    // FIXME-DPI: Provide consistent standards for reference size. Perhaps using g.CurrentDpiScale would be more self explanatory.
    // This is will lead us to non-rounded WidthRequest in columns, which should work but is a poorly tested path.
    const float new_ref_scale_unit = g.FontSize; // g.Font->GetCharAdvance('A') ?
    if (table->RefScale != 0.0f && table->RefScale != new_ref_scale_unit)
    {
        const float scale_factor = new_ref_scale_unit / table->RefScale;
        //IMGUI_DEBUG_LOG("[table] %08X RefScaleUnit %.3f -> %.3f, scaling width by %.3f\n", table->ID, table->RefScaleUnit, new_ref_scale_unit, scale_factor);
        for (int n = 0; n < columns_count; n++)
            table->Columns[n].WidthRequest = table->Columns[n].WidthRequest * scale_factor;
    }
    table->RefScale = new_ref_scale_unit;

    // Disable output until user calls TableNextRow() or TableNextColumn() leading to the TableUpdateLayout() call..
    // This is not strictly necessary but will reduce cases were "out of table" output will be misleading to the user.
    // Because we cannot safely assert in EndTable() when no rows have been created, this seems like our best option.
    inner_window->SkipItems = true;

    // Clear names
    // At this point the ->NameOffset field of each column will be invalid until TableUpdateLayout() or the first call to TableSetupColumn()
    if (table->ColumnsNames.Buf.Size > 0)
        table->ColumnsNames.Buf.resize(0);

    // Apply queued resizing/reordering/hiding requests
    TableBeginApplyRequests(table);

    return true;
}